

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lexer.cpp
# Opt level: O0

size_t __thiscall TokenStream::TextStream::offset_for_line(TextStream *this,size_t lineno)

{
  size_type sVar1;
  const_reference pvVar2;
  logic_error *this_00;
  size_t i;
  size_t lineno_local;
  TextStream *this_local;
  
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->line_offset);
  if (lineno - 1 < sVar1) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->line_offset,lineno - 1);
    return *pvVar2;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"bad `lineno` in TokenStream::offset_for_line");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

size_t TokenStream::TextStream::offset_for_line(size_t lineno) const
{
    size_t i = (lineno - 1);
    if(i < line_offset.size())
        return line_offset[i];
    else
        throw std::logic_error("bad `lineno` in TokenStream::offset_for_line");
}